

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O2

void __thiscall Controller::Controller(Controller *this)

{
  _Head_base<0UL,_Board_*,_false> _Var1;
  _Head_base<0UL,_Board_*,_false> local_30;
  undefined4 local_28;
  BoardMode local_24;
  
  (this->board)._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
  super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.super__Head_base<0UL,_Board_*,_false>
  ._M_head_impl = (Board *)0x0;
  (this->imageProvider)._M_t.
  super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>._M_t.
  super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
  super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl = (ImageProvider *)0x0;
  (this->undoMoveService)._M_t.super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
  super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
  super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl = (UndoMove *)0x0;
  local_24 = NUMERIC;
  local_28 = 0;
  std::make_unique<Board,BoardSize,BoardMode>((BoardSize *)&local_30,&local_24);
  _Var1._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (Board *)0x0;
  std::__uniq_ptr_impl<Board,_std::default_delete<Board>_>::reset
            ((__uniq_ptr_impl<Board,_std::default_delete<Board>_> *)this,_Var1._M_head_impl);
  std::unique_ptr<Board,_std::default_delete<Board>_>::~unique_ptr
            ((unique_ptr<Board,_std::default_delete<Board>_> *)&local_30);
  std::make_unique<UndoMove>();
  _Var1._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (Board *)0x0;
  std::__uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>::reset
            ((__uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_> *)&this->undoMoveService,
             (pointer)_Var1._M_head_impl);
  std::unique_ptr<UndoMove,_std::default_delete<UndoMove>_>::~unique_ptr
            ((unique_ptr<UndoMove,_std::default_delete<UndoMove>_> *)&local_30);
  return;
}

Assistant:

Controller::Controller() 
{
    board = std::make_unique<Board>( BoardSize::FOUR, BoardMode::NUMERIC );
    undoMoveService = std::make_unique<UndoMove>();
}